

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::UnderscoresToCamelCase
                   (string *__return_storage_ptr__,string *input,bool cap_next_letter)

{
  ulong uVar1;
  char *pcVar2;
  int local_20;
  byte local_19;
  int i;
  bool cap_next_letter_local;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_19 = cap_next_letter;
  for (local_20 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_20 < uVar1;
      local_20 = local_20 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if ((*pcVar2 < 'a') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), 'z' < *pcVar2)) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if ((*pcVar2 < 'A') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), 'Z' < *pcVar2)) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        if (('/' < *pcVar2) &&
           (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar2 < ':')) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
        }
        local_19 = 1;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
        local_19 = 0;
      }
    }
    else {
      if ((local_19 & 1) == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2 + -0x20);
      }
      local_19 = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(const std::string& input,
                                   bool cap_next_letter) {
  std::string result;
  // Note:  I distrust ctype.h due to locales.
  for (int i = 0; i < input.size(); i++) {
    if ('a' <= input[i] && input[i] <= 'z') {
      if (cap_next_letter) {
        result += input[i] + ('A' - 'a');
      } else {
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('A' <= input[i] && input[i] <= 'Z') {
      // Capital letters are left as-is.
      result += input[i];
      cap_next_letter = false;
    } else if ('0' <= input[i] && input[i] <= '9') {
      result += input[i];
      cap_next_letter = true;
    } else {
      cap_next_letter = true;
    }
  }
  return result;
}